

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recompose.hpp
# Opt level: O3

void __thiscall
MGARD::Recomposer<float>::recompose
          (Recomposer<float> *this,float *data_,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *dims,size_t target_level,
          bool hierarchical,vector<unsigned_long,_std::allocator<unsigned_long>_> *strides)

{
  pointer puVar1;
  pointer puVar2;
  float *pfVar3;
  size_t *psVar4;
  size_t sVar5;
  size_t sVar6;
  size_t dim0_stride;
  size_t dim1_stride;
  ostream *poVar7;
  pointer puVar8;
  uint uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  long lVar12;
  size_t sVar13;
  bool bVar14;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_68;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_48;
  
  this->data = data_;
  puVar1 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    sVar13 = 4;
  }
  else {
    lVar12 = 1;
    puVar8 = puVar1;
    do {
      lVar12 = lVar12 * *puVar8;
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar2);
    sVar13 = lVar12 * 4;
  }
  if ((strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
               (long)puVar2 - (long)puVar1 >> 3,(allocator_type *)&local_48);
    puVar1 = (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_68.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_68.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_68.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((puVar1 != (pointer)0x0) &&
       (operator_delete(puVar1),
       local_68.
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_68.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    puVar1 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar9 = (int)((ulong)((long)puVar2 - (long)puVar1) >> 3) - 1;
    if (-1 < (int)uVar9) {
      puVar8 = (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (ulong)uVar9;
      uVar11 = 1;
      do {
        puVar8[uVar10] = uVar11;
        uVar11 = uVar11 * puVar1[uVar10];
        bVar14 = uVar10 != 0;
        uVar10 = uVar10 - 1;
      } while (bVar14);
    }
    if (puVar2 != puVar1) {
      uVar10 = 0;
      do {
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)(dims->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(dims->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  this->data_buffer_size = sVar13;
  init(this,(EVP_PKEY_CTX *)dims);
  if ((this->level_dims).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->level_dims).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    init_levels(&local_48,dims,target_level);
    local_68.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->level_dims).
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->level_dims).
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->level_dims).
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->level_dims).
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->level_dims).
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_48.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->level_dims).
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_68);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_48);
  }
  uVar10 = (ulong)(1 << ((char)target_level - 1U & 0x1f));
  lVar12 = (long)(dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  if (lVar12 == 1) {
    if (target_level != 0) {
      lVar12 = 0x18;
      do {
        sVar13 = **(size_t **)
                   ((long)&(((this->level_dims).
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data + lVar12);
        if (hierarchical) {
          recompose_level_1D_hierarhical_basis(this,this->data,sVar13,(float)uVar10,true);
        }
        else {
          recompose_level_1D(this,this->data,sVar13,(float)uVar10,true);
        }
        lVar12 = lVar12 + 0x18;
        target_level = target_level - 1;
        uVar10 = uVar10 >> 1;
      } while (target_level != 0);
    }
  }
  else if (lVar12 == 2) {
    if (target_level != 0) {
      lVar12 = 0x18;
      do {
        pfVar3 = this->data;
        psVar4 = *(size_t **)
                  ((long)&(((this->level_dims).
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data + lVar12);
        sVar13 = *psVar4;
        sVar5 = psVar4[1];
        if (hierarchical) {
          sVar6 = *(strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          recover_from_interpolant_difference_2D(this,pfVar3,sVar13,sVar5,sVar6);
          data_reverse_reorder_2D<float>(pfVar3,this->data_buffer,sVar13,sVar5,sVar6);
        }
        else {
          recompose_level_2D(this,pfVar3,sVar13,sVar5,(float)uVar10,
                             *(strides->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start);
        }
        uVar10 = uVar10 >> 1;
        lVar12 = lVar12 + 0x18;
        target_level = target_level - 1;
      } while (target_level != 0);
    }
  }
  else if ((lVar12 == 3) && (target_level != 0)) {
    lVar12 = 0x18;
    do {
      pfVar3 = this->data;
      psVar4 = *(size_t **)
                ((long)&(((this->level_dims).
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data + lVar12);
      sVar13 = *psVar4;
      sVar5 = psVar4[1];
      sVar6 = psVar4[2];
      if (hierarchical) {
        psVar4 = (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        dim0_stride = *psVar4;
        dim1_stride = psVar4[1];
        recover_from_interpolant_difference_3D
                  (this,pfVar3,sVar13,sVar5,sVar6,dim0_stride,dim1_stride);
        data_reverse_reorder_3D<float>
                  (pfVar3,this->data_buffer,sVar13,sVar5,sVar6,dim0_stride,dim1_stride);
      }
      else {
        psVar4 = (strides->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        recompose_level_3D(this,pfVar3,sVar13,sVar5,sVar6,(float)uVar10,*psVar4,psVar4[1]);
      }
      uVar10 = uVar10 >> 1;
      lVar12 = lVar12 + 0x18;
      target_level = target_level - 1;
    } while (target_level != 0);
  }
  return;
}

Assistant:

void recompose(T * data_, const vector<size_t>& dims, size_t target_level, bool hierarchical=false, vector<size_t> strides=vector<size_t>()){
		data = data_;
		size_t num_elements = 1;
		for(const auto& d:dims){
			num_elements *= d;
		}
		if(strides.size() == 0){
			strides = vector<size_t>(dims.size());
			size_t stride = 1;
			for(int i=dims.size()-1; i>=0; i--){
				strides[i] = stride;
				stride *= dims[i];
			}
			for(int i=0; i<dims.size(); i++){
				cout << strides[i] << " ";
			}
			cout << endl;
		}
		data_buffer_size = num_elements * sizeof(T);
		init(dims);
        if(level_dims.empty()){
            level_dims = init_levels(dims, target_level);
        }
		size_t h = 1 << (target_level - 1);
		if(dims.size() == 1){
			for(int i=0; i<target_level; i++){
				hierarchical ? recompose_level_1D_hierarhical_basis(data, level_dims[i+1][0], h) : recompose_level_1D(data, level_dims[i+1][0], h);
				h >>= 1;
			}
		}
		else if(dims.size() == 2){
			for(int i=0; i<target_level; i++){
				size_t n1 = level_dims[i+1][0];
				size_t n2 = level_dims[i+1][1];
				hierarchical ? recompose_level_2D_hierarhical_basis(data, n1, n2, (T)h, strides[0]) : recompose_level_2D(data, n1, n2, (T)h, strides[0]);
				h >>= 1;
			}
		}
        else if(dims.size() == 3){
            for(int i=0; i<target_level; i++){
                size_t n1 = level_dims[i+1][0];
                size_t n2 = level_dims[i+1][1];
                size_t n3 = level_dims[i+1][2];
                hierarchical ? recompose_level_3D_hierarchical_basis(data, n1, n2, n3, (T)h, strides[0], strides[1]) : recompose_level_3D(data, n1, n2, n3, (T)h, strides[0], strides[1]);
                h >>= 1;
            }
        }
	}